

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O0

pair<unsigned_int,_unsigned_int> __thiscall
llvm::SourceMgr::getLineAndColumn(SourceMgr *this,SMLoc Loc,uint BufferID)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  unsigned_short uVar4;
  uint uVar5;
  pointer pMVar6;
  size_t sVar7;
  pair<unsigned_int,_unsigned_long> pVar8;
  unsigned_long local_c0;
  pair<unsigned_int,_unsigned_long> local_b8;
  StringRef local_a8;
  StringRef local_98;
  size_type local_88;
  size_t NewlineOffs;
  char *BufStart;
  size_t sStack_70;
  uint LineNo;
  size_t Sz;
  char *Ptr;
  SrcBuffer *SB;
  uint local_4c;
  SourceMgr *pSStack_48;
  uint BufferID_local;
  SourceMgr *this_local;
  SMLoc Loc_local;
  
  local_4c = BufferID;
  pSStack_48 = this;
  this_local = (SourceMgr *)Loc.Ptr;
  if (BufferID == 0) {
    SB = (SrcBuffer *)Loc.Ptr;
    local_4c = FindBufferContainingLoc(this,Loc);
  }
  if (local_4c != 0) {
    Ptr = (char *)getBufferInfo(this,local_4c);
    Sz = (size_t)SMLoc::getPointer((SMLoc *)&this_local);
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                        Ptr);
    sVar7 = MemoryBuffer::getBufferSize(pMVar6);
    sStack_70 = sVar7;
    bVar3 = std::numeric_limits<unsigned_char>::max();
    uVar1 = sStack_70;
    if (bVar3 < sVar7) {
      uVar4 = std::numeric_limits<unsigned_short>::max();
      uVar2 = sStack_70;
      if (uVar4 < uVar1) {
        uVar5 = std::numeric_limits<unsigned_int>::max();
        if (uVar5 < uVar2) {
          BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_long>((SrcBuffer *)Ptr,(char *)Sz);
        }
        else {
          BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_int>((SrcBuffer *)Ptr,(char *)Sz);
        }
      }
      else {
        BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_short>((SrcBuffer *)Ptr,(char *)Sz);
      }
    }
    else {
      BufStart._4_4_ = SrcBuffer::getLineNumber<unsigned_char>((SrcBuffer *)Ptr,(char *)Sz);
    }
    pMVar6 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
             operator->((unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> *)
                        Ptr);
    NewlineOffs = (size_t)MemoryBuffer::getBufferStart(pMVar6);
    local_98.Length = Sz - NewlineOffs;
    local_98.Data = (char *)NewlineOffs;
    strlen("\n\r");
    local_88 = StringRef::find_last_of(&local_98,local_a8,0xffffffffffffffff);
    if (local_88 == 0xffffffffffffffff) {
      local_88 = 0xffffffffffffffff;
    }
    local_c0 = (Sz - NewlineOffs) - local_88;
    pVar8 = std::make_pair<unsigned_int&,unsigned_long>((uint *)((long)&BufStart + 4),&local_c0);
    local_b8.second = pVar8.second;
    local_b8.first = pVar8.first;
    std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_long,_true>
              ((pair<unsigned_int,_unsigned_int> *)&Loc_local,&local_b8);
    return (pair<unsigned_int,_unsigned_int>)Loc_local.Ptr;
  }
  __assert_fail("BufferID && \"Invalid Location!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                ,0x85,
                "std::pair<unsigned int, unsigned int> llvm::SourceMgr::getLineAndColumn(SMLoc, unsigned int) const"
               );
}

Assistant:

std::pair<unsigned, unsigned>
SourceMgr::getLineAndColumn(SMLoc Loc, unsigned BufferID) const {
  if (!BufferID)
    BufferID = FindBufferContainingLoc(Loc);
  assert(BufferID && "Invalid Location!");

  auto &SB = getBufferInfo(BufferID);
  const char *Ptr = Loc.getPointer();

  size_t Sz = SB.Buffer->getBufferSize();
  unsigned LineNo;
  if (Sz <= std::numeric_limits<uint8_t>::max())
    LineNo = SB.getLineNumber<uint8_t>(Ptr);
  else if (Sz <= std::numeric_limits<uint16_t>::max())
    LineNo = SB.getLineNumber<uint16_t>(Ptr);
  else if (Sz <= std::numeric_limits<uint32_t>::max())
    LineNo = SB.getLineNumber<uint32_t>(Ptr);
  else
    LineNo = SB.getLineNumber<uint64_t>(Ptr);

  const char *BufStart = SB.Buffer->getBufferStart();
  size_t NewlineOffs = StringRef(BufStart, Ptr-BufStart).find_last_of("\n\r");
  if (NewlineOffs == StringRef::npos) NewlineOffs = ~(size_t)0;
  return std::make_pair(LineNo, Ptr-BufStart-NewlineOffs);
}